

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_setup_conn(Curl_easy *data,_Bool *protocol_done)

{
  connectdata *conn;
  CURLcode CVar1;
  _Bool _Var2;
  curltime cVar3;
  
  conn = data->conn;
  Curl_pgrsTime(data,TIMER_NAMELOOKUP);
  if ((conn->handler->flags & 0x10) == 0) {
    cVar3 = Curl_now();
    (conn->now).tv_sec = cVar3.tv_sec;
    (conn->now).tv_usec = cVar3.tv_usec;
    if (((ulong)conn->bits & 0x40) == 0) {
      _Var2 = false;
      CVar1 = Curl_conn_setup(data,conn,0,conn->dns_entry,-1);
      if (CVar1 != CURLE_OK) goto LAB_0015dc08;
    }
    CVar1 = Curl_headers_init(data);
    _Var2 = false;
  }
  else {
    CVar1 = CURLE_OK;
    _Var2 = true;
  }
LAB_0015dc08:
  *protocol_done = _Var2;
  return CVar1;
}

Assistant:

CURLcode Curl_setup_conn(struct Curl_easy *data,
                         bool *protocol_done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  Curl_pgrsTime(data, TIMER_NAMELOOKUP);

  if(conn->handler->flags & PROTOPT_NONETWORK) {
    /* nothing to setup when not using a network */
    *protocol_done = TRUE;
    return result;
  }

  /* set start time here for timeout purposes in the connect procedure, it
     is later set again for the progress meter purpose */
  conn->now = Curl_now();
  if(!conn->bits.reuse)
    result = Curl_conn_setup(data, conn, FIRSTSOCKET, conn->dns_entry,
                             CURL_CF_SSL_DEFAULT);
  if(!result)
    result = Curl_headers_init(data);

  /* not sure we need this flag to be passed around any more */
  *protocol_done = FALSE;
  return result;
}